

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpint.c
# Opt level: O2

void mp_dump(FILE *fp,char *prefix,mp_int *x,char *suffix)

{
  byte bVar1;
  size_t byte;
  
  fprintf((FILE *)fp,"%s0x",prefix);
  byte = x->nw * 8;
  while (byte = byte - 1, byte != 0xffffffffffffffff) {
    bVar1 = mp_get_byte(x,byte);
    fprintf((FILE *)fp,"%02X",(ulong)bVar1);
  }
  fputs(suffix,(FILE *)fp);
  return;
}

Assistant:

void mp_dump(FILE *fp, const char *prefix, mp_int *x, const char *suffix)
{
    fprintf(fp, "%s0x", prefix);
    for (size_t i = mp_max_bytes(x); i-- > 0 ;)
        fprintf(fp, "%02X", mp_get_byte(x, i));
    fputs(suffix, fp);
}